

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O0

void __thiscall
wasm::DeNaN::addFunc
          (DeNaN *this,Module *module,Name name,Type type,Literal *literal,
          optional<wasm::BinaryOp> op)

{
  BinaryOp op_00;
  bool bVar1;
  BinaryOp *pBVar2;
  LocalGet *right;
  Binary *pBVar3;
  Binary *pBVar4;
  LocalGet *pLVar5;
  Const *ifFalse;
  If *pIVar6;
  pointer pFVar7;
  Name name_00;
  optional<wasm::Type> type_00;
  undefined1 local_138 [12];
  Literal local_128;
  _Optional_payload_base<wasm::BinaryOp> local_110;
  Binary *local_108;
  Binary *lastTwo;
  Binary *firstTwo;
  anon_class_16_2_b3a5d210 getLaneCheck;
  anon_class_16_2_29df2df6 getLane;
  BasicType local_c4;
  Binary *local_c0;
  Expression *condition;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_a8;
  _Optional_payload_base<wasm::BinaryOp> local_90;
  _Optional_payload_base<wasm::BinaryOp> local_88;
  Signature local_80;
  HeapType local_70;
  char *local_68;
  HeapType HStack_60;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_50;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Builder builder;
  Literal *literal_local;
  Module *module_local;
  DeNaN *this_local;
  optional<wasm::BinaryOp> op_local;
  Type type_local;
  Name name_local;
  
  this_local = (DeNaN *)op.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::BinaryOp>;
  op_local.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::BinaryOp> =
       (_Optional_base<wasm::BinaryOp,_true,_true>)
       (_Optional_base<wasm::BinaryOp,_true,_true>)type.id;
  Builder::Builder((Builder *)&func,module);
  local_88 = (_Optional_payload_base<wasm::BinaryOp>)
             op_local.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::BinaryOp>;
  local_90 = (_Optional_payload_base<wasm::BinaryOp>)
             op_local.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::BinaryOp>;
  local_68 = name.super_IString.str._M_len;
  HStack_60.id = (uintptr_t)name.super_IString.str._M_str;
  Signature::Signature
            (&local_80,
             (Type)op_local.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::BinaryOp>,
             (Type)op_local.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::BinaryOp>);
  HeapType::HeapType(&local_70,local_80);
  local_a8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_a8);
  name_00.super_IString.str._M_str = local_68;
  name_00.super_IString.str._M_len = (size_t)&local_50;
  Builder::makeFunction
            (name_00,HStack_60,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_70.id,
             (Expression *)&local_a8);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_a8);
  local_c4 = v128;
  bVar1 = wasm::Type::operator!=((Type *)&op_local,&local_c4);
  if (bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
    if (!bVar1) {
      __assert_fail("op",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeNaN.cpp"
                    ,0xa7,
                    "void wasm::DeNaN::addFunc(Module *, Name, Type, Literal, std::optional<BinaryOp>)"
                   );
    }
    pBVar2 = std::optional<wasm::BinaryOp>::operator*((optional<wasm::BinaryOp> *)&this_local);
    op_00 = *pBVar2;
    pLVar5 = Builder::makeLocalGet
                       ((Builder *)&func,0,
                        (Type)op_local.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::BinaryOp>);
    right = Builder::makeLocalGet
                      ((Builder *)&func,0,
                       (Type)op_local.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::BinaryOp>);
    local_c0 = Builder::makeBinary((Builder *)&func,op_00,(Expression *)pLVar5,(Expression *)right);
  }
  else {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!op",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeNaN.cpp"
                    ,0xab,
                    "void wasm::DeNaN::addFunc(Module *, Name, Type, Literal, std::optional<BinaryOp>)"
                   );
    }
    firstTwo = (Binary *)&func;
    getLaneCheck.builder = (Builder *)&getLaneCheck.getLane;
    getLaneCheck.getLane = (anon_class_16_2_29df2df6 *)firstTwo;
    pBVar3 = addFunc::anon_class_16_2_b3a5d210::operator()((anon_class_16_2_b3a5d210 *)&firstTwo,0);
    pBVar4 = addFunc::anon_class_16_2_b3a5d210::operator()((anon_class_16_2_b3a5d210 *)&firstTwo,1);
    lastTwo = Builder::makeBinary((Builder *)&func,AndInt32,(Expression *)pBVar3,
                                  (Expression *)pBVar4);
    pBVar3 = addFunc::anon_class_16_2_b3a5d210::operator()((anon_class_16_2_b3a5d210 *)&firstTwo,2);
    pBVar4 = addFunc::anon_class_16_2_b3a5d210::operator()((anon_class_16_2_b3a5d210 *)&firstTwo,3);
    local_108 = Builder::makeBinary((Builder *)&func,AndInt32,(Expression *)pBVar3,
                                    (Expression *)pBVar4);
    local_c0 = Builder::makeBinary((Builder *)&func,AndInt32,(Expression *)lastTwo,
                                   (Expression *)local_108);
  }
  pBVar3 = local_c0;
  local_110 = (_Optional_payload_base<wasm::BinaryOp>)
              op_local.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::BinaryOp>;
  pLVar5 = Builder::makeLocalGet
                     ((Builder *)&func,0,
                      (Type)op_local.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::BinaryOp>);
  wasm::Literal::Literal(&local_128,literal);
  ifFalse = Builder::makeConst((Builder *)&func,&local_128);
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_138);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_138._0_8_;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_138[8];
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_138._9_3_;
  pIVar6 = Builder::makeIf((Builder *)&func,(Expression *)pBVar3,(Expression *)pLVar5,
                           (Expression *)ifFalse,type_00);
  pFVar7 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_50);
  pFVar7->body = (Expression *)pIVar6;
  wasm::Literal::~Literal(&local_128);
  Module::addFunction(module,&local_50);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_50);
  return;
}

Assistant:

void addFunc(Module* module,
               Name name,
               Type type,
               Literal literal,
               std::optional<BinaryOp> op = {}) {
    Builder builder(*module);
    auto func = Builder::makeFunction(name, Signature(type, type), {});
    // Compare the value to itself to check if it is a NaN, and return 0 if
    // so:
    //
    //   (if (result f*)
    //     (f*.eq
    //       (local.get $0)
    //       (local.get $0)
    //     )
    //     (local.get $0)
    //     (f*.const 0)
    //   )
    Expression* condition;
    if (type != Type::v128) {
      // Generate a simple condition.
      assert(op);
      condition = builder.makeBinary(
        *op, builder.makeLocalGet(0, type), builder.makeLocalGet(0, type));
    } else {
      assert(!op);
      // v128 is trickier as the 128 bits may contain f32s or f64s, and we
      // need to check for nans both ways in principle. However, the f32 NaN
      // pattern is a superset of f64, since it checks less bits (8 bit
      // exponent vs 11), and it is checked in more places (4 32-bit values vs
      // 2 64-bit ones), so we can just check that. That is, this reduces to 4
      // checks of f32s, but is otherwise the same as a check of a single f32.
      //
      // However there is additional complexity, which is that if we do
      // EqVecF32x4 then we get all-1s for each case where we compare equal.
      // That itself is a NaN pattern, which means that running this pass
      // twice would interfere with itself. To avoid that we'd need a way to
      // detect our previous instrumentation and not instrument it, but that
      // is tricky (we can't depend on function names etc. while fuzzing).
      // Instead, extract the lanes and use f32 checks.
      auto getLane = [&](Index index) {
        return builder.makeSIMDExtract(
          ExtractLaneVecF32x4, builder.makeLocalGet(0, type), index);
      };
      auto getLaneCheck = [&](Index index) {
        return builder.makeBinary(EqFloat32, getLane(index), getLane(index));
      };
      auto* firstTwo =
        builder.makeBinary(AndInt32, getLaneCheck(0), getLaneCheck(1));
      auto* lastTwo =
        builder.makeBinary(AndInt32, getLaneCheck(2), getLaneCheck(3));
      condition = builder.makeBinary(AndInt32, firstTwo, lastTwo);
    }
    func->body = builder.makeIf(
      condition, builder.makeLocalGet(0, type), builder.makeConst(literal));
    module->addFunction(std::move(func));
  }